

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

vector<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>,_std::allocator<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>_>_>
* llava_uhd::slice_image(clip_image_u8 *img,slice_instructions *inst)

{
  bool bVar1;
  clip_image_u8 *pcVar2;
  type pcVar3;
  pointer in_RDX;
  clip_image_u8 *in_RSI;
  clip_image_u8 *in_RDI;
  clip_image_u8 *unaff_retaddr;
  clip_image_u8_ptr img_slice;
  int h;
  int w;
  int y;
  int x;
  slice_coordinates *slice;
  const_iterator __end1;
  const_iterator __begin1;
  vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_> *__range1;
  clip_image_u8_ptr refined_img;
  clip_image_u8_ptr resized_img;
  vector<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>,_std::allocator<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>_>_>
  *output;
  pointer in_stack_ffffffffffffff08;
  type in_stack_ffffffffffffff10;
  clip_image_u8 *in_stack_ffffffffffffff20;
  clip_image_u8 *in_stack_ffffffffffffff28;
  type in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff40;
  clip_image_u8 *src;
  __normal_iterator<const_llava_uhd::slice_coordinates_*,_std::vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>_>
  in_stack_ffffffffffffffa8;
  clip_image_u8 *in_stack_ffffffffffffffb0;
  ushort in_stack_ffffffffffffffbb;
  array<unsigned_char,_3UL> in_stack_ffffffffffffffc5;
  byte local_19;
  pointer local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  pcVar2 = in_RDI;
  std::
  vector<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>,_std::allocator<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>_>_>
  ::vector((vector<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>,_std::allocator<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>_>_>
            *)0x1ce189);
  clip_image_u8_init();
  src = (clip_image_u8 *)&stack0xffffffffffffffd8;
  std::unique_ptr<clip_image_u8,clip_image_u8_deleter>::unique_ptr<clip_image_u8_deleter,void>
            ((unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08);
  std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>::operator*
            ((unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)in_stack_ffffffffffffff10);
  image_manipulation::bicubic_resize(unaff_retaddr,pcVar2,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  std::
  vector<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>,_std::allocator<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>_>_>
  ::push_back((vector<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>,_std::allocator<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>_>_>
               *)in_stack_ffffffffffffff10,(value_type *)in_stack_ffffffffffffff08);
  bVar1 = std::vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>::
          empty((vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                 *)in_stack_ffffffffffffff20);
  if (bVar1) {
    local_19 = 1;
  }
  else {
    pcVar2 = clip_image_u8_init();
    std::unique_ptr<clip_image_u8,clip_image_u8_deleter>::unique_ptr<clip_image_u8_deleter,void>
              ((unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08);
    if ((local_18[0x30] & 1) == 0) {
      in_stack_ffffffffffffff30 =
           std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>::operator*
                     ((unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)in_stack_ffffffffffffff10)
      ;
      image_manipulation::bilinear_resize
                (src,pcVar2,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                 (int)in_stack_ffffffffffffff40);
    }
    else {
      std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>::operator*
                ((unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)in_stack_ffffffffffffff10);
      image_manipulation::resize_and_pad_image
                ((clip_image_u8 *)((ulong)in_stack_ffffffffffffffbb << 0x18),
                 in_stack_ffffffffffffffb0,(clip_image_size *)in_stack_ffffffffffffffa8._M_current,
                 in_stack_ffffffffffffffc5);
      in_RSI = in_stack_ffffffffffffff28;
    }
    std::vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>::begin
              ((vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                *)in_stack_ffffffffffffff08);
    std::vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>::end
              ((vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                *)in_stack_ffffffffffffff08);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_llava_uhd::slice_coordinates_*,_std::vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>_>
                          *)in_stack_ffffffffffffff10,
                         (__normal_iterator<const_llava_uhd::slice_coordinates_*,_std::vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>_>
                          *)in_stack_ffffffffffffff08);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_llava_uhd::slice_coordinates_*,_std::vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>_>
      ::operator*((__normal_iterator<const_llava_uhd::slice_coordinates_*,_std::vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>_>
                   *)&stack0xffffffffffffffa8);
      in_stack_ffffffffffffff20 = clip_image_u8_init();
      std::unique_ptr<clip_image_u8,clip_image_u8_deleter>::unique_ptr<clip_image_u8_deleter,void>
                ((unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08);
      pcVar3 = std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>::operator*
                         ((unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)
                          in_stack_ffffffffffffff10);
      in_stack_ffffffffffffff10 =
           std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>::operator*
                     ((unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)in_stack_ffffffffffffff10)
      ;
      image_manipulation::crop_image
                (in_stack_ffffffffffffff30,in_RSI,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                 (int)in_stack_ffffffffffffff20,(int)((ulong)pcVar3 >> 0x20),(int)pcVar3);
      std::
      vector<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>,_std::allocator<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>_>_>
      ::push_back((vector<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>,_std::allocator<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>_>_>
                   *)in_stack_ffffffffffffff10,(value_type *)in_stack_ffffffffffffff08);
      std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>::~unique_ptr
                ((unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)in_stack_ffffffffffffff10);
      __gnu_cxx::
      __normal_iterator<const_llava_uhd::slice_coordinates_*,_std::vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>_>
      ::operator++((__normal_iterator<const_llava_uhd::slice_coordinates_*,_std::vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>_>
                    *)&stack0xffffffffffffffa8);
    }
    local_19 = 1;
    std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>::~unique_ptr
              ((unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)in_stack_ffffffffffffff10);
  }
  std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>::~unique_ptr
            ((unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)in_stack_ffffffffffffff10);
  if ((local_19 & 1) == 0) {
    std::
    vector<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>,_std::allocator<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>_>_>
    ::~vector((vector<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>,_std::allocator<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>_>_>
               *)in_stack_ffffffffffffff20);
  }
  return (vector<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>,_std::allocator<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>_>_>
          *)in_RDI;
}

Assistant:

static std::vector<clip_image_u8_ptr> slice_image(const clip_image_u8 * img, const slice_instructions & inst) {
        std::vector<clip_image_u8_ptr> output;

        // resize to overview size
        clip_image_u8_ptr resized_img(clip_image_u8_init());
        image_manipulation::bicubic_resize(*img, *resized_img, inst.overview_size.width, inst.overview_size.height);
        output.push_back(std::move(resized_img));
        if (inst.slices.empty()) {
            // no slices, just return the resized image
            return output;
        }

        // resize to refined size
        clip_image_u8_ptr refined_img(clip_image_u8_init());
        if (inst.padding_refined) {
            image_manipulation::resize_and_pad_image(*img, *refined_img, inst.refined_size);
        } else {
            image_manipulation::bilinear_resize(*img, *refined_img, inst.refined_size.width, inst.refined_size.height);
        }

        // create slices
        for (const auto & slice : inst.slices) {
            int x = slice.x;
            int y = slice.y;
            int w = slice.size.width;
            int h = slice.size.height;

            clip_image_u8_ptr img_slice(clip_image_u8_init());
            image_manipulation::crop_image(*refined_img, *img_slice, x, y, w, h);
            output.push_back(std::move(img_slice));
        }

        return output;
    }